

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

OnCallSpec<test_result_(char)> * __thiscall
testing::internal::FunctionMockerBase<test_result_(char)>::FindOnCallSpec
          (FunctionMockerBase<test_result_(char)> *this,ArgumentTuple *args)

{
  bool bVar1;
  reference ppvVar2;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
  *in_RDI;
  OnCallSpec<test_result_(char)> *spec;
  const_reverse_iterator it;
  OnCallSpec<test_result_(char)> *in_stack_ffffffffffffffd0;
  vector<const_void_*,_std::allocator<const_void_*>_> *in_stack_ffffffffffffffd8;
  OnCallSpec<test_result_(char)> *in_stack_ffffffffffffffe0;
  
  std::vector<const_void_*,_std::allocator<const_void_*>_>::rbegin(in_stack_ffffffffffffffd8);
  while( true ) {
    std::vector<const_void_*,_std::allocator<const_void_*>_>::rend(in_stack_ffffffffffffffd8);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                             *)in_stack_ffffffffffffffd0,in_RDI);
    if (!bVar1) {
      return (OnCallSpec<test_result_(char)> *)0x0;
    }
    ppvVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                           *)in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd0 = (OnCallSpec<test_result_(char)> *)*ppvVar2;
    bVar1 = OnCallSpec<test_result_(char)>::Matches
                      (in_stack_ffffffffffffffe0,(ArgumentTuple *)in_stack_ffffffffffffffd8);
    if (bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                  *)in_stack_ffffffffffffffd0);
  }
  return in_stack_ffffffffffffffd0;
}

Assistant:

const OnCallSpec<F>* FindOnCallSpec(
      const ArgumentTuple& args) const {
    for (UntypedOnCallSpecs::const_reverse_iterator it
             = untyped_on_call_specs_.rbegin();
         it != untyped_on_call_specs_.rend(); ++it) {
      const OnCallSpec<F>* spec = static_cast<const OnCallSpec<F>*>(*it);
      if (spec->Matches(args))
        return spec;
    }

    return NULL;
  }